

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnWriter<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::
WriteVectorInternal<false>
          (StandardColumnWriter<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  idx_t i;
  Allocator *pAVar1;
  long lVar2;
  idx_t iVar3;
  primitive_dictionary_entry_t *ppVar4;
  InternalException *this_00;
  ValidityMask *mask;
  WriteStream *ser;
  Vector *pVVar5;
  idx_t r;
  idx_t iVar6;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  StandardColumnWriter<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *local_40;
  DlbaEncoder *local_38;
  
  ser = (WriteStream *)chunk_start;
  local_40 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_00269ea1_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Unknown encoding","");
    duckdb::InternalException::InternalException(this_00,(string *)local_60);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  pVVar5 = *(Vector **)(input_column + 0x20);
  mask = (ValidityMask *)(input_column + 0x28);
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if (*(long *)mask == 0) {
      TemplatedWritePlain<duckdb::float_na_equal,float,duckdb::FloatingPointOperator,true>
                (pVVar5,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<duckdb::float_na_equal,float,duckdb::FloatingPointOperator,false>
              (pVVar5,stats,chunk_start,chunk_end,mask,temp_writer);
    return;
  default:
    goto switchD_00269ea1_caseD_1;
  case 5:
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      iVar6 = chunk_start;
      do {
        iVar3 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar3 = iVar6, (*(ulong *)(*(long *)mask + (iVar6 >> 6) * 8) >> (iVar6 & 0x3f) & 1) != 0
           )) {
          local_60[0] = (undefined1 *)CONCAT44(local_60[0]._4_4_,*(float *)(pVVar5 + iVar3 * 4));
          FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                    (stats,*(float *)(pVVar5 + iVar3 * 4));
          DbpEncoder::BeginWrite<float>
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(float *)local_60);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          chunk_start = iVar3 + 1;
          goto LAB_0026a216;
        }
        iVar6 = iVar6 + 1;
      } while (chunk_end != iVar6);
    }
    else {
LAB_0026a216:
      if (chunk_start < chunk_end) {
        do {
          if ((*(long *)mask == 0) ||
             ((*(ulong *)(*(long *)mask + (chunk_start >> 6) * 8) >> (chunk_start & 0x3f) & 1) != 0)
             ) {
            local_60[0] = (undefined1 *)
                          CONCAT44(local_60[0]._4_4_,*(float *)(pVVar5 + chunk_start * 4));
            FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                      (stats,*(float *)(pVVar5 + chunk_start * 4));
            DbpEncoder::WriteValue<float>
                      ((DbpEncoder *)(page_state_p + 2),temp_writer,(float *)local_60);
          }
          chunk_start = chunk_start + 1;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 6:
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      iVar6 = chunk_start;
      do {
        iVar3 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar3 = iVar6, (*(ulong *)(*(long *)mask + (iVar6 >> 6) * 8) >> (iVar6 & 0x3f) & 1) != 0
           )) {
          local_60[0] = (undefined1 *)CONCAT44(local_60[0]._4_4_,*(float *)(pVVar5 + iVar3 * 4));
          FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                    (stats,*(float *)(pVVar5 + iVar3 * 4));
          local_38 = (DlbaEncoder *)(page_state_p + 0x909);
          pAVar1 = (Allocator *)
                   duckdb::BufferAllocator::Get
                             (((local_40->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<float>(local_38,pAVar1,temp_writer,(float *)local_60);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          chunk_start = iVar3 + 1;
          goto LAB_0026a0e0;
        }
        iVar6 = iVar6 + 1;
      } while (chunk_end != iVar6);
    }
    else {
LAB_0026a0e0:
      if (chunk_start < chunk_end) {
        do {
          if ((*(long *)mask == 0) ||
             ((*(ulong *)(*(long *)mask + (chunk_start >> 6) * 8) >> (chunk_start & 0x3f) & 1) != 0)
             ) {
            local_60[0] = (undefined1 *)
                          CONCAT44(local_60[0]._4_4_,*(float *)(pVVar5 + chunk_start * 4));
            FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                      (stats,*(float *)(pVVar5 + chunk_start * 4));
            DlbaEncoder::WriteValue<float>
                      ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,(float *)local_60);
          }
          chunk_start = chunk_start + 1;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 8:
    iVar6 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      iVar3 = chunk_start;
      do {
        iVar6 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar6 = iVar3, (*(ulong *)(*(long *)mask + (iVar3 >> 6) * 8) >> (iVar3 & 0x3f) & 1) != 0
           )) {
          local_60[0] = (undefined1 *)
                        CONCAT71(local_60[0]._1_7_,
                                 *(undefined1 *)
                                  ((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4));
          (*(code *)**(undefined8 **)temp_writer)(temp_writer,local_60,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          goto LAB_0026a177;
        }
        iVar3 = iVar3 + 1;
      } while (chunk_end != iVar3);
    }
    else {
LAB_0026a177:
      if (iVar6 < chunk_end) {
        pVVar5 = pVVar5 + iVar6 * 4;
        do {
          if ((*(long *)mask == 0) ||
             ((*(ulong *)(*(long *)mask + (iVar6 >> 6) * 8) >> (iVar6 & 0x3f) & 1) != 0)) {
            ppVar4 = PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>
                     ::Lookup((PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>
                               *)page_state_p[0x121b]._vptr_ColumnWriterPageState,
                              (float_na_equal *)pVVar5);
            local_60[0] = (undefined1 *)CONCAT44(local_60[0]._4_4_,ppVar4->index);
            RleBpEncoder::WriteValue
                      ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)local_60);
          }
          iVar6 = iVar6 + 1;
          pVVar5 = (Vector *)((float_na_equal *)pVVar5 + 4);
        } while (chunk_end != iVar6);
      }
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar1 = (Allocator *)
               duckdb::BufferAllocator::Get
                         (((local_40->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar1);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    if (chunk_start < chunk_end) {
      do {
        if ((*(long *)mask == 0) ||
           ((*(ulong *)(*(long *)mask + (chunk_start >> 6) * 8) >> (chunk_start & 0x3f) & 1) != 0))
        {
          local_60[0] = (undefined1 *)
                        CONCAT44(local_60[0]._4_4_,*(float *)(pVVar5 + chunk_start * 4));
          FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                    (stats,*(float *)(pVVar5 + chunk_start * 4));
          lVar2 = 0;
          do {
            *(undefined1 *)
             ((long)page_state_p[0x1217]._vptr_ColumnWriterPageState +
             (long)((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar2 +
                   (long)page_state_p[0x1219]._vptr_ColumnWriterPageState)) =
                 *(undefined1 *)((long)local_60 + lVar2);
            lVar2 = lVar2 + 1;
          } while (lVar2 != 4);
          page_state_p[0x1217]._vptr_ColumnWriterPageState =
               (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        }
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}